

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCameraSceneNode.cpp
# Opt level: O0

void __thiscall
irr::scene::CCameraSceneNode::CCameraSceneNode
          (CCameraSceneNode *this,ISceneNode *parent,ISceneManager *mgr,s32 id,vector3df *position,
          vector3df *lookat)

{
  uint uVar1;
  int iVar2;
  aabbox3d<float> *this_00;
  undefined4 extraout_var;
  long lVar3;
  uint *puVar4;
  undefined4 in_ECX;
  ISceneManager *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  void **in_R8;
  undefined8 *in_R9;
  IVideoDriver *d;
  CCameraSceneNode *this_01;
  vector3df *in_stack_ffffffffffffff68;
  long *plVar5;
  float id_00;
  ISceneManager *mgr_00;
  undefined4 in_stack_ffffffffffffff80;
  ICameraSceneNode *in_stack_ffffffffffffff90;
  vector3df *in_stack_ffffffffffffffa0;
  vector3df *in_stack_ffffffffffffffa8;
  CCameraSceneNode *in_stack_ffffffffffffffb0;
  undefined1 local_48 [48];
  ISceneManager *local_18;
  float fStack_c;
  
  fStack_c = (float)((ulong)in_RSI >> 0x20);
  local_48._24_8_ = in_R9;
  local_48._32_8_ = in_R8;
  local_48._44_4_ = in_ECX;
  local_18 = in_RDX;
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)(in_RDI + 0x51));
  mgr_00 = local_18;
  id_00 = fStack_c;
  core::vector3d<float>::vector3d((vector3d<float> *)(local_48 + 0xc),0.0,0.0,0.0);
  core::vector3d<float>::vector3d((vector3d<float> *)local_48,1.0,1.0,1.0);
  this_01 = (CCameraSceneNode *)local_48;
  ICameraSceneNode::ICameraSceneNode
            (in_stack_ffffffffffffff90,(void **)local_48._32_8_,
             (ISceneNode *)CONCAT44(local_48._44_4_,in_stack_ffffffffffffff80),mgr_00,(s32)id_00,
             in_stack_ffffffffffffff68,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8);
  *in_RDI = 0x4388a0;
  in_RDI[0x51] = 0x438ac8;
  in_RDI[0x1c] = 0x438a98;
  this_00 = (aabbox3d<float> *)((long)in_RDI + 0xec);
  core::vector3d<float>::vector3d((vector3d<float> *)&stack0xffffffffffffffac,0.0,0.0,0.0);
  core::aabbox3d<float>::aabbox3d(this_00,(vector3d<float> *)&stack0xffffffffffffffac);
  *(undefined8 *)((long)in_RDI + 0x104) = *(undefined8 *)local_48._24_8_;
  *(undefined4 *)((long)in_RDI + 0x10c) = *(undefined4 *)(local_48._24_8_ + 8);
  core::vector3d<float>::vector3d((vector3d<float> *)(in_RDI + 0x22),0.0,1.0,0.0);
  *(undefined4 *)((long)in_RDI + 0x124) = 0x3f800000;
  *(undefined4 *)(in_RDI + 0x25) = 0x453b8000;
  SViewFrustum::SViewFrustum((SViewFrustum *)CONCAT44(local_48._44_4_,in_stack_ffffffffffffff80));
  core::CMatrix4<float>::CMatrix4
            ((CMatrix4<float> *)this_01,(eConstructor)((ulong)(local_48 + 0xc) >> 0x20));
  *(undefined1 *)((long)in_RDI + 0x284) = 1;
  *(undefined1 *)((long)in_RDI + 0x285) = 0;
  *(undefined4 *)((long)in_RDI + 0x11c) = 0x3fa0d97c;
  *(undefined4 *)(in_RDI + 0x24) = 0x3faaaaab;
  if (local_18 == (ISceneManager *)0x0) {
    plVar5 = (long *)0x0;
  }
  else {
    iVar2 = (*local_18->_vptr_ISceneManager[2])();
    plVar5 = (long *)CONCAT44(extraout_var,iVar2);
  }
  if ((plVar5 != (long *)0x0) &&
     (lVar3 = (**(code **)(*plVar5 + 0x1e0))(), *(int *)(lVar3 + 4) != 0)) {
    puVar4 = (uint *)(**(code **)(*plVar5 + 0x1e0))();
    uVar1 = *puVar4;
    lVar3 = (**(code **)(*plVar5 + 0x1e0))();
    *(float *)(in_RDI + 0x24) = (float)uVar1 / (float)*(uint *)(lVar3 + 4);
  }
  SViewFrustum::setFarNearDistance
            ((SViewFrustum *)((long)in_RDI + 300),
             *(float *)(in_RDI + 0x25) - *(float *)((long)in_RDI + 0x124));
  recalculateProjectionMatrix(this_01);
  recalculateViewArea(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

CCameraSceneNode::CCameraSceneNode(ISceneNode *parent, ISceneManager *mgr, s32 id,
		const core::vector3df &position, const core::vector3df &lookat) :
		ICameraSceneNode(parent, mgr, id, position),
		BoundingBox(core::vector3df(0, 0, 0)), // Camera has no size. Still not sure if FLT_MAX might be the better variant
		Target(lookat), UpVector(0.0f, 1.0f, 0.0f), ZNear(1.0f), ZFar(3000.0f),
		InputReceiverEnabled(true), TargetAndRotationAreBound(false)
{
#ifdef _DEBUG
	setDebugName("CCameraSceneNode");
#endif

	// set default projection
	Fovy = core::PI / 2.5f; // Field of view, in radians.
	Aspect = 4.0f / 3.0f;   // Aspect ratio.

	const video::IVideoDriver *const d = mgr ? mgr->getVideoDriver() : 0;
	if (d) {
		if (d->getCurrentRenderTargetSize().Height)
			Aspect = (f32)d->getCurrentRenderTargetSize().Width /
					 (f32)d->getCurrentRenderTargetSize().Height;
	}

	ViewArea.setFarNearDistance(ZFar - ZNear);
	recalculateProjectionMatrix();
	recalculateViewArea();
}